

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall
RPCResult::RPCResult
          (RPCResult *this,string *cond,Type type,string *m_key_name,bool optional,
          string *description,vector<RPCResult,_std::allocator<RPCResult>_> *inner)

{
  long lVar1;
  undefined4 in_EDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  RPCResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  int line;
  char *in_stack_ffffffffffffffb0;
  bool *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&(in_RDI->_M_dataplus)._M_p = in_EDX;
  this_00 = (RPCResult *)&in_RDI->_M_string_length;
  std::__cxx11::string::string(in_RDI,in_stack_ffffffffffffff90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffff58,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)0x5a7576);
  *(byte *)&in_RDI[2]._M_dataplus._M_p = in_R8B & 1;
  *(undefined1 *)((long)&in_RDI[2]._M_dataplus._M_p + 1) = 0;
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &in_RDI[2]._M_string_length;
  std::__cxx11::string::string(in_RDI,__str);
  line = (int)((ulong)&in_RDI[3]._M_string_length >> 0x20);
  std::__cxx11::string::string(in_RDI,__str);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
            (in_stack_ffffffffffffff58);
  inline_check_non_fatal<bool>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,line,in_RSI,(char *)in_RDI);
  CheckInnerDoc(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResult(
        std::string cond,
        Type type,
        std::string m_key_name,
        bool optional,
        std::string description,
        std::vector<RPCResult> inner = {})
        : m_type{std::move(type)},
          m_key_name{std::move(m_key_name)},
          m_inner{std::move(inner)},
          m_optional{optional},
          m_skip_type_check{false},
          m_description{std::move(description)},
          m_cond{std::move(cond)}
    {
        CHECK_NONFATAL(!m_cond.empty());
        CheckInnerDoc();
    }